

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption.cc
# Opt level: O2

fdb_status fdb_init_encryptor(encryptor *e,fdb_encryption_key *key)

{
  int iVar1;
  encryption_ops *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  fdb_encryption_algorithm_t fVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  fdb_status fVar10;
  encryption_ops **ppeVar11;
  
  iVar1 = key->algorithm;
  if (iVar1 == -1) {
    ppeVar11 = &fdb_encryption_ops_bogus;
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 != 0) {
        e->ops = (encryption_ops *)0x0;
        return FDB_RESULT_CRYPTO_ERROR;
      }
      e->ops = (encryption_ops *)0x0;
      return FDB_RESULT_SUCCESS;
    }
    ppeVar11 = &fdb_encryption_ops_aes;
  }
  peVar2 = *ppeVar11;
  e->ops = peVar2;
  if (peVar2 == (encryption_ops *)0x0) {
    return FDB_RESULT_CRYPTO_ERROR;
  }
  *(undefined4 *)((e->key).bytes + 0x1c) = *(undefined4 *)(key->bytes + 0x1c);
  fVar5 = key->algorithm;
  uVar6 = key->bytes[0];
  uVar7 = key->bytes[1];
  uVar8 = key->bytes[2];
  uVar9 = key->bytes[3];
  uVar3 = *(undefined8 *)(key->bytes + 4);
  uVar4 = *(undefined8 *)(key->bytes + 0x14);
  *(undefined8 *)((e->key).bytes + 0xc) = *(undefined8 *)(key->bytes + 0xc);
  *(undefined8 *)((e->key).bytes + 0x14) = uVar4;
  (e->key).algorithm = fVar5;
  (e->key).bytes[0] = uVar6;
  (e->key).bytes[1] = uVar7;
  (e->key).bytes[2] = uVar8;
  (e->key).bytes[3] = uVar9;
  *(undefined8 *)((e->key).bytes + 4) = uVar3;
  fVar10 = (*peVar2->setup)(e);
  return fVar10;
}

Assistant:

fdb_status fdb_init_encryptor(encryptor *e,
                              const fdb_encryption_key *key)
{
    if (key->algorithm == FDB_ENCRYPTION_NONE) {
        e->ops = NULL;
        return FDB_RESULT_SUCCESS;
    }
#ifdef FDB_LOG_CRYPTO
    fprintf(stderr, "CRYPT: Initializing context for key %d:%llx\n",
            key->algorithm, *(uint64_t*)key->bytes);
#endif
    e->ops = get_encryption_ops(key->algorithm);
    if (!e->ops)
        return FDB_RESULT_CRYPTO_ERROR; // unsupported algorithm
    e->key = *key;
    return e->ops->setup(e);
}